

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

void Js::JavascriptOperators::SetAttributes
               (RecyclableObject *object,PropertyId propId,PropertyDescriptor *descriptor,bool force
               )

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  uint uVar6;
  
  if (object == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x2666,"(object)","object");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (descriptor->valueSpecified == false && descriptor->writableSpecified == false) {
    bVar3 = descriptor->setterSpecified | descriptor->getterSpecified;
LAB_00abd687:
    uVar6 = (uint)bVar3;
  }
  else {
    uVar6 = 0;
    if (descriptor->writableSpecified != false) {
      bVar3 = PropertyDescriptor::IsWritable(descriptor);
      goto LAB_00abd687;
    }
  }
  if ((force) || ((descriptor->configurableSpecified & 1U) != 0)) {
    uVar5 = 0;
    if ((descriptor->configurableSpecified & 1U) != 0) {
      bVar2 = PropertyDescriptor::IsConfigurable(descriptor);
      uVar5 = (ulong)bVar2;
    }
    (*(object->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x3c])(object,propId,uVar5);
    if (!force) goto LAB_00abd6c2;
    bVar3 = descriptor->enumerableSpecified;
LAB_00abd6ca:
    uVar5 = 0;
    if ((bVar3 & 1) != 0) {
      bVar2 = PropertyDescriptor::IsEnumerable(descriptor);
      uVar5 = (ulong)bVar2;
    }
    (*(object->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x3d])(object,propId,uVar5);
    if (force) goto LAB_00abd709;
  }
  else {
LAB_00abd6c2:
    bVar3 = descriptor->enumerableSpecified;
    if ((Type)bVar3 == true) goto LAB_00abd6ca;
  }
  if ((uVar6 == 0) && (descriptor->writableSpecified == false)) {
    return;
  }
LAB_00abd709:
  (*(object->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
    [0x3b])(object,propId,(ulong)uVar6);
  return;
}

Assistant:

void JavascriptOperators::SetAttributes(RecyclableObject* object, PropertyId propId, const PropertyDescriptor& descriptor, bool force)
    {
        Assert(object);

        BOOL isWritable = FALSE;
        if (descriptor.IsDataDescriptor())
        {
            isWritable = descriptor.WritableSpecified() ? descriptor.IsWritable() : FALSE;
        }
        else if (descriptor.IsAccessorDescriptor())
        {
            // The reason is that JavascriptOperators::OP_SetProperty checks for VarTo<RecyclableObject>(instance)->IsWritableOrAccessor(propertyId),
            // which should in fact check for 'is writable or accessor' but since there is no GetAttributes, we can't do that efficiently.
            isWritable = TRUE;
        }

        // CONSIDER: call object->SetAttributes which is much more efficient as that's 1 call instead of 3.
        //       Can't do that now as object->SetAttributes doesn't provide a way which attributes to modify and which not.
        if (force || descriptor.ConfigurableSpecified())
        {
            object->SetConfigurable(propId, descriptor.ConfigurableSpecified() ? descriptor.IsConfigurable() : FALSE);
        }
        if (force || descriptor.EnumerableSpecified())
        {
            object->SetEnumerable(propId, descriptor.EnumerableSpecified() ? descriptor.IsEnumerable() : FALSE);
        }
        if (force || descriptor.WritableSpecified() || isWritable)
        {
            object->SetWritable(propId, isWritable);
        }
    }